

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O3

void Abc_QuickSortCostData(int *pCosts,int nSize,int fDecrease,word *pData,int *pResult)

{
  ulong uVar1;
  ulong uVar2;
  
  if (0 < nSize) {
    uVar1 = 0;
    uVar2 = 0;
    do {
      pData[uVar2] = (long)pCosts[uVar2] | uVar1;
      uVar2 = uVar2 + 1;
      uVar1 = uVar1 + 0x100000000;
    } while ((uint)nSize != uVar2);
    Abc_QuickSort3(pData,nSize,fDecrease);
    if (0 < nSize) {
      uVar1 = 0;
      do {
        pResult[uVar1] = *(int *)((long)pData + uVar1 * 8 + 4);
        uVar1 = uVar1 + 1;
      } while ((uint)nSize != uVar1);
    }
    return;
  }
  Abc_QuickSort3(pData,nSize,fDecrease);
  return;
}

Assistant:

void Abc_QuickSortCostData( int * pCosts, int nSize, int fDecrease, word * pData, int * pResult )
{
    int i;
    for ( i = 0; i < nSize; i++ )
        pData[i] = ((word)i << 32) | pCosts[i];
    Abc_QuickSort3( pData, nSize, fDecrease );
    for ( i = 0; i < nSize; i++ )
        pResult[i] = (int)(pData[i] >> 32);
}